

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeRTBase::checkResults
          (TextureCubeMapArrayTextureSizeRTBase *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  GLboolean GVar6;
  undefined **ppuVar7;
  GLuint read_size [4];
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  read_size[0] = 0;
  read_size[1] = 0;
  read_size[2] = 0;
  read_size[3] = 0;
  (**(code **)(lVar4 + 0x78))(0x8ca8,this->m_read_fbo_id);
  (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_std_id,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x49f);
  checkFramebufferStatus(this,0x8ca8);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x8d99,0x1405,read_size);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4a5);
  if ((read_size[0] == width) && (read_size[1] == height)) {
    GVar6 = '\x01';
    if (read_size[2] == depth / 6) goto LAB_00d3f71b;
  }
  local_1b0._0_8_ =
       ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)(local_1b0 + 8),"Storage Type: ");
  ppuVar7 = &imMutableStorage;
  if (storType == ST_MUTABLE) {
    ppuVar7 = (undefined **)&mutableStorage;
  }
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,ppuVar7);
  poVar1 = &pMVar5->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "textureSize() for samplerCubeArray returned wrong values of [width][height][layers]. They are equal to"
                 );
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] but should be ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  GVar6 = '\0';
LAB_00d3f71b:
  (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_shw_id,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4b5);
  checkFramebufferStatus(this,0x8ca8);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x8d99,0x1405,read_size);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4bb);
  if (((read_size[0] != width) || (read_size[1] != height)) || (read_size[2] != depth / 6)) {
    local_1b0._0_8_ =
         ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Storage Type: ");
    ppuVar7 = &imMutableStorage;
    if (storType == ST_MUTABLE) {
      ppuVar7 = (undefined **)&mutableStorage;
    }
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,ppuVar7);
    poVar1 = &pMVar5->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "textureSize() for samplerCubeArrayShadow returned wrong values of [width][height][layers]. They are equal to"
                   );
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] but should be ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    GVar6 = '\0';
  }
  return GVar6;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeRTBase::checkResults(glw::GLuint width, glw::GLuint height,
																  glw::GLuint depth, STORAGE_TYPE storType)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;

	glw::GLuint read_size[m_n_rt_components];
	memset(read_size, 0, m_n_rt_components * sizeof(glw::GLuint));

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	/* Compare returned results of textureSize() called for samplerCubeArray sampler*/
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_std_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage) << "\n"
			<< "textureSize() for samplerCubeArray returned wrong values of [width][height][layers]. They are equal to"
			<< "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2] << "] but should be "
			<< "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
			<< tcu::TestLog::EndMessage;
		test_passed = false;
	}

	/* Compare returned results of textureSize() for samplerCubeArrayShadow sampler*/
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_shw_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog() << tcu::TestLog::Message
								  << "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage)
								  << "\n"
								  << "textureSize() for samplerCubeArrayShadow returned wrong values of "
									 "[width][height][layers]. They are equal to"
								  << "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2]
								  << "] but should be "
								  << "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
								  << tcu::TestLog::EndMessage;
		test_passed = false;
	}

	return test_passed;
}